

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O1

void duckdb_zstd::HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *args)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  void *pvVar6;
  BYTE *pBVar7;
  bool bVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  BYTE *pBVar12;
  int iVar13;
  ulong uVar14;
  BYTE *pBVar15;
  ulong uVar16;
  ulong uVar17;
  U64 UVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  U64 UVar26;
  ulong *puVar27;
  ulong uVar28;
  ulong uVar29;
  ulong *puVar30;
  ulong *puVar31;
  ulong uVar32;
  BYTE *local_110;
  U64 local_108;
  BYTE *local_100;
  ulong *local_f0;
  BYTE *local_d8 [4];
  ulong *local_b8 [12];
  BYTE *local_58 [5];
  
  pvVar6 = args->dt;
  pBVar7 = args->ilowest;
  UVar18 = args->bits[0];
  local_108 = args->bits[1];
  UVar26 = args->bits[2];
  uVar20 = args->bits[3];
  local_f0 = (ulong *)args->ip[0];
  puVar31 = (ulong *)args->ip[1];
  puVar30 = (ulong *)args->ip[2];
  puVar27 = (ulong *)args->ip[3];
  local_b8[2] = puVar30;
  local_b8[3] = puVar27;
  local_b8[0] = local_f0;
  local_b8[1] = puVar31;
  local_100 = args->op[0];
  local_110 = args->op[1];
  local_58[1] = args->op[2];
  local_58[2] = args->op[3];
  local_d8[0] = local_100;
  local_d8[1] = local_110;
  local_d8[2] = local_58[1];
  local_d8[3] = local_58[2];
  local_58[0] = local_110;
  local_58[3] = args->oend;
  do {
    lVar21 = 0;
    uVar16 = (ulong)((long)local_f0 - (long)pBVar7) / 7;
    do {
      uVar14 = (ulong)((long)local_58[lVar21] - (long)local_d8[lVar21]) / 10;
      if (uVar16 < uVar14) {
        uVar14 = uVar16;
      }
      lVar21 = lVar21 + 1;
      uVar16 = uVar14;
    } while (lVar21 != 4);
    if (uVar14 == 0) {
      iVar13 = 2;
      bVar8 = false;
    }
    else {
      lVar21 = 1;
      do {
        bVar8 = local_b8[lVar21] >= local_b8[lVar21 + -1];
        if (local_b8[lVar21] < local_b8[lVar21 + -1]) {
          iVar13 = 10;
          goto LAB_003b647e;
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 4);
      iVar13 = 0;
    }
LAB_003b647e:
    if (bVar8) {
      pBVar15 = local_58[2] + uVar14 * 5;
      pBVar12 = local_58[1];
      do {
        uVar16 = UVar18 >> 0x35;
        bVar1 = *(byte *)((long)pvVar6 + uVar16 * 4 + 2);
        uVar17 = (ulong)*(byte *)((long)pvVar6 + uVar16 * 4 + 3);
        *(undefined2 *)local_100 = *(undefined2 *)((long)pvVar6 + uVar16 * 4);
        uVar14 = local_108 >> 0x35;
        uVar16 = UVar18 << ((ulong)bVar1 & 0x3f);
        bVar1 = *(byte *)((long)pvVar6 + uVar14 * 4 + 2);
        uVar23 = (ulong)*(byte *)((long)pvVar6 + uVar14 * 4 + 3);
        *(undefined2 *)local_110 = *(undefined2 *)((long)pvVar6 + uVar14 * 4);
        uVar14 = UVar26 >> 0x35;
        bVar2 = *(byte *)((long)pvVar6 + uVar14 * 4 + 2);
        uVar32 = (ulong)*(byte *)((long)pvVar6 + uVar14 * 4 + 3);
        uVar25 = uVar16 >> 0x35;
        *(undefined2 *)pBVar12 = *(undefined2 *)((long)pvVar6 + uVar14 * 4);
        bVar3 = *(byte *)((long)pvVar6 + uVar25 * 4 + 2);
        uVar24 = (ulong)*(byte *)((long)pvVar6 + uVar25 * 4 + 3);
        *(undefined2 *)(local_100 + uVar17) = *(undefined2 *)((long)pvVar6 + uVar25 * 4);
        uVar14 = local_108 << ((ulong)bVar1 & 0x3f);
        uVar25 = UVar26 << ((ulong)bVar2 & 0x3f);
        uVar22 = uVar14 >> 0x35;
        bVar1 = *(byte *)((long)pvVar6 + uVar22 * 4 + 2);
        uVar19 = (ulong)*(byte *)((long)pvVar6 + uVar22 * 4 + 3);
        *(undefined2 *)(local_110 + uVar23) = *(undefined2 *)((long)pvVar6 + uVar22 * 4);
        uVar22 = uVar25 >> 0x35;
        bVar2 = *(byte *)((long)pvVar6 + uVar22 * 4 + 2);
        uVar29 = (ulong)*(byte *)((long)pvVar6 + uVar22 * 4 + 3);
        *(undefined2 *)(pBVar12 + uVar32) = *(undefined2 *)((long)pvVar6 + uVar22 * 4);
        uVar16 = uVar16 << ((ulong)bVar3 & 0x3f);
        uVar14 = uVar14 << ((ulong)bVar1 & 0x3f);
        uVar22 = uVar16 >> 0x35;
        bVar1 = *(byte *)((long)pvVar6 + uVar22 * 4 + 2);
        uVar28 = (ulong)*(byte *)((long)pvVar6 + uVar22 * 4 + 3);
        *(undefined2 *)(local_100 + uVar24 + uVar17) = *(undefined2 *)((long)pvVar6 + uVar22 * 4);
        uVar22 = uVar14 >> 0x35;
        lVar21 = uVar24 + uVar17;
        bVar3 = *(byte *)((long)pvVar6 + uVar22 * 4 + 2);
        uVar17 = (ulong)*(byte *)((long)pvVar6 + uVar22 * 4 + 3);
        *(undefined2 *)(local_110 + uVar19 + uVar23) = *(undefined2 *)((long)pvVar6 + uVar22 * 4);
        lVar10 = uVar19 + uVar23;
        uVar25 = uVar25 << ((ulong)bVar2 & 0x3f);
        uVar16 = uVar16 << ((ulong)bVar1 & 0x3f);
        uVar23 = uVar25 >> 0x35;
        bVar1 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
        uVar24 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
        *(undefined2 *)(pBVar12 + uVar29 + uVar32) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
        uVar23 = uVar16 >> 0x35;
        lVar11 = uVar29 + uVar32;
        bVar2 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
        uVar19 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
        *(undefined2 *)(local_100 + uVar28 + lVar21) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
        lVar21 = uVar28 + lVar21;
        uVar14 = uVar14 << ((ulong)bVar3 & 0x3f);
        uVar25 = uVar25 << ((ulong)bVar1 & 0x3f);
        uVar23 = uVar14 >> 0x35;
        bVar1 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
        uVar22 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
        *(undefined2 *)(local_110 + uVar17 + lVar10) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
        uVar32 = uVar25 >> 0x35;
        lVar10 = uVar17 + lVar10;
        bVar3 = *(byte *)((long)pvVar6 + uVar32 * 4 + 2);
        uVar23 = (ulong)*(byte *)((long)pvVar6 + uVar32 * 4 + 3);
        *(undefined2 *)(pBVar12 + uVar24 + lVar11) = *(undefined2 *)((long)pvVar6 + uVar32 * 4);
        lVar11 = uVar24 + lVar11;
        uVar16 = uVar16 << ((ulong)bVar2 & 0x3f);
        uVar14 = uVar14 << ((ulong)bVar1 & 0x3f);
        uVar17 = uVar16 >> 0x35;
        bVar1 = *(byte *)((long)pvVar6 + uVar17 * 4 + 2);
        bVar2 = *(byte *)((long)pvVar6 + uVar17 * 4 + 3);
        *(undefined2 *)(local_100 + uVar19 + lVar21) = *(undefined2 *)((long)pvVar6 + uVar17 * 4);
        uVar17 = uVar14 >> 0x35;
        bVar4 = *(byte *)((long)pvVar6 + uVar17 * 4 + 2);
        bVar5 = *(byte *)((long)pvVar6 + uVar17 * 4 + 3);
        *(undefined2 *)(local_110 + uVar22 + lVar10) = *(undefined2 *)((long)pvVar6 + uVar17 * 4);
        uVar25 = uVar25 << ((ulong)bVar3 & 0x3f);
        local_100 = local_100 + (ulong)bVar2 + uVar19 + lVar21;
        local_110 = local_110 + (ulong)bVar5 + uVar22 + lVar10;
        uVar14 = uVar14 << ((ulong)bVar4 & 0x3f);
        uVar22 = uVar25 >> 0x35;
        bVar2 = *(byte *)((long)pvVar6 + uVar22 * 4 + 2);
        local_58[1] = pBVar12 + (ulong)*(byte *)((long)pvVar6 + uVar22 * 4 + 3) + uVar23 + lVar11;
        *(undefined2 *)(pBVar12 + uVar23 + lVar11) = *(undefined2 *)((long)pvVar6 + uVar22 * 4);
        uVar25 = uVar25 << ((ulong)bVar2 & 0x3f);
        uVar23 = uVar20 >> 0x35;
        bVar2 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
        uVar22 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
        *(undefined2 *)local_58[2] = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
        uVar20 = uVar20 << ((ulong)bVar2 & 0x3f);
        uVar23 = uVar20 >> 0x35;
        bVar2 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
        uVar17 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
        *(undefined2 *)(local_58[2] + uVar22) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
        uVar20 = uVar20 << ((ulong)bVar2 & 0x3f);
        uVar9 = 0;
        for (uVar16 = uVar16 << ((ulong)bVar1 & 0x3f); (uVar16 & 1) == 0;
            uVar16 = uVar16 >> 1 | 0x8000000000000000) {
          uVar9 = uVar9 + 1;
        }
        lVar21 = uVar17 + uVar22;
        local_f0 = (ulong *)((long)local_f0 - (ulong)(uVar9 >> 3));
        UVar18 = (*local_f0 | 1) << ((byte)uVar9 & 7);
        uVar23 = uVar20 >> 0x35;
        bVar1 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
        uVar16 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
        *(undefined2 *)(local_58[2] + uVar17 + uVar22) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
        uVar20 = uVar20 << ((ulong)bVar1 & 0x3f);
        uVar9 = 0;
        for (; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
          uVar9 = uVar9 + 1;
        }
        lVar10 = uVar16 + lVar21;
        puVar31 = (ulong *)((long)puVar31 - (ulong)(uVar9 >> 3));
        local_108 = (*puVar31 | 1) << ((byte)uVar9 & 7);
        uVar23 = uVar20 >> 0x35;
        uVar14 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
        uVar20 = uVar20 << ((ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 2) & 0x3f);
        uVar9 = 0;
        for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
          uVar9 = uVar9 + 1;
        }
        *(undefined2 *)(local_58[2] + uVar16 + lVar21) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
        puVar30 = (ulong *)((long)puVar30 - (ulong)(uVar9 >> 3));
        uVar16 = *puVar30;
        uVar25 = uVar20 >> 0x35;
        bVar1 = *(byte *)((long)pvVar6 + uVar25 * 4 + 2);
        bVar2 = *(byte *)((long)pvVar6 + uVar25 * 4 + 3);
        *(undefined2 *)(local_58[2] + uVar14 + lVar10) = *(undefined2 *)((long)pvVar6 + uVar25 * 4);
        UVar26 = (uVar16 | 1) << ((byte)uVar9 & 7);
        uVar16 = 0;
        for (uVar20 = uVar20 << ((ulong)bVar1 & 0x3f); (uVar20 & 1) == 0;
            uVar20 = uVar20 >> 1 | 0x8000000000000000) {
          uVar16 = uVar16 + 1;
        }
        local_58[2] = local_58[2] + (ulong)bVar2 + uVar14 + lVar10;
        puVar27 = (ulong *)((long)puVar27 - (uVar16 >> 3 & 0x1fffffff));
        uVar20 = (*puVar27 | 1) << (uVar16 & 7);
        pBVar12 = local_58[1];
      } while (local_58[2] < pBVar15);
      local_d8[0] = local_100;
      local_d8[1] = local_110;
      local_d8[2] = local_58[1];
      local_d8[3] = local_58[2];
      local_b8[0] = local_f0;
      local_b8[1] = puVar31;
      local_b8[2] = puVar30;
      local_b8[3] = puVar27;
      iVar13 = 0;
    }
    if (iVar13 != 0) {
      args->bits[0] = UVar18;
      args->bits[1] = local_108;
      args->bits[2] = UVar26;
      args->bits[3] = uVar20;
      args->ip[2] = (BYTE *)local_b8[2];
      args->ip[3] = (BYTE *)local_b8[3];
      args->ip[0] = (BYTE *)local_b8[0];
      args->ip[1] = (BYTE *)local_b8[1];
      args->op[0] = local_d8[0];
      args->op[1] = local_d8[1];
      args->op[2] = local_d8[2];
      args->op[3] = local_d8[3];
      return;
    }
  } while( true );
}

Assistant:

static HUF_FAST_BMI2_ATTRS
void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs* args)
{
    U64 bits[4];
    BYTE const* ip[4];
    BYTE* op[4];
    BYTE* oend[4];
    HUF_DEltX2 const* const dtable = (HUF_DEltX2 const*)args->dt;
    BYTE const* const ilowest = args->ilowest;

    /* Copy the arguments to local registers. */
    ZSTD_memcpy(&bits, &args->bits, sizeof(bits));
    ZSTD_memcpy((void*)(&ip), &args->ip, sizeof(ip));
    ZSTD_memcpy(&op, &args->op, sizeof(op));

    oend[0] = op[1];
    oend[1] = op[2];
    oend[2] = op[3];
    oend[3] = args->oend;

    assert(MEM_isLittleEndian());
    assert(!MEM_32bits());

    for (;;) {
        BYTE* olimit;
        int stream;

        /* Assert loop preconditions */
#ifndef NDEBUG
        for (stream = 0; stream < 4; ++stream) {
            assert(op[stream] <= oend[stream]);
            assert(ip[stream] >= ilowest);
        }
#endif
        /* Compute olimit */
        {
            /* Each loop does 5 table lookups for each of the 4 streams.
             * Each table lookup consumes up to 11 bits of input, and produces
             * up to 2 bytes of output.
             */
            /* We can consume up to 7 bytes of input per iteration per stream.
             * We also know that each input pointer is >= ip[0]. So we can run
             * iters loops before running out of input.
             */
            size_t iters = (size_t)(ip[0] - ilowest) / 7;
            /* Each iteration can produce up to 10 bytes of output per stream.
             * Each output stream my advance at different rates. So take the
             * minimum number of safe iterations among all the output streams.
             */
            for (stream = 0; stream < 4; ++stream) {
                size_t const oiters = (size_t)(oend[stream] - op[stream]) / 10;
                iters = MIN(iters, oiters);
            }

            /* Each iteration produces at least 5 output symbols. So until
             * op[3] crosses olimit, we know we haven't executed iters
             * iterations yet. This saves us maintaining an iters counter,
             * at the expense of computing the remaining # of iterations
             * more frequently.
             */
            olimit = op[3] + (iters * 5);

            /* Exit the fast decoding loop once we reach the end. */
            if (op[3] == olimit)
                break;

            /* Exit the decoding loop if any input pointer has crossed the
             * previous one. This indicates corruption, and a precondition
             * to our loop is that ip[i] >= ip[0].
             */
            for (stream = 1; stream < 4; ++stream) {
                if (ip[stream] < ip[stream - 1])
                    goto _out;
            }
        }

#ifndef NDEBUG
        for (stream = 1; stream < 4; ++stream) {
            assert(ip[stream] >= ip[stream - 1]);
        }
#endif

#define HUF_4X2_DECODE_SYMBOL(_stream, _decode3)                      \
    do {                                                              \
        if ((_decode3) || (_stream) != 3) {                           \
            int const index = (int)(bits[(_stream)] >> 53);           \
            HUF_DEltX2 const entry = dtable[index];                   \
            MEM_write16(op[(_stream)], entry.sequence); \
            bits[(_stream)] <<= (entry.nbBits) & 0x3F;                \
            op[(_stream)] += (entry.length);                          \
        }                                                             \
    } while (0)

#define HUF_4X2_RELOAD_STREAM(_stream)                                  \
    do {                                                                \
        HUF_4X2_DECODE_SYMBOL(3, 1);                                    \
        {                                                               \
            int const ctz = ZSTD_countTrailingZeros64(bits[(_stream)]); \
            int const nbBits = ctz & 7;                                 \
            int const nbBytes = ctz >> 3;                               \
            ip[(_stream)] -= nbBytes;                                   \
            bits[(_stream)] = MEM_read64(ip[(_stream)]) | 1;            \
            bits[(_stream)] <<= nbBits;                                 \
        }                                                               \
    } while (0)

        /* Manually unroll the loop because compilers don't consistently
         * unroll the inner loops, which destroys performance.
         */
        do {
            /* Decode 5 symbols from each of the first 3 streams.
             * The final stream will be decoded during the reload phase
             * to reduce register pressure.
             */
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X2_DECODE_SYMBOL, 0);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X2_DECODE_SYMBOL, 0);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X2_DECODE_SYMBOL, 0);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X2_DECODE_SYMBOL, 0);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X2_DECODE_SYMBOL, 0);

            /* Decode one symbol from the final stream */
            HUF_4X2_DECODE_SYMBOL(3, 1);

            /* Decode 4 symbols from the final stream & reload bitstreams.
             * The final stream is reloaded last, meaning that all 5 symbols
             * are decoded from the final stream before it is reloaded.
             */
            HUF_4X_FOR_EACH_STREAM(HUF_4X2_RELOAD_STREAM);
        } while (op[3] < olimit);
    }

#undef HUF_4X2_DECODE_SYMBOL
#undef HUF_4X2_RELOAD_STREAM

_out:

    /* Save the final values of each of the state variables back to args. */
    ZSTD_memcpy(&args->bits, &bits, sizeof(bits));
    ZSTD_memcpy((void*)(&args->ip), &ip, sizeof(ip));
    ZSTD_memcpy(&args->op, &op, sizeof(op));
}